

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlNodeSetDoc(xmlNodePtr node,xmlDocPtr doc)

{
  xmlElementType xVar1;
  xmlDocPtr doc_00;
  int iVar2;
  xmlChar *pxVar3;
  xmlEntityPtr pxVar4;
  uint uVar5;
  xmlDictPtr dict;
  _xmlDict *dict_00;
  xmlAttrPtr attr;
  uint uVar6;
  
  doc_00 = node->doc;
  if (doc_00 == (xmlDocPtr)0x0) {
    dict_00 = (xmlDictPtr)0x0;
  }
  else {
    dict_00 = doc_00->dict;
  }
  uVar5 = 0;
  if (doc == (xmlDocPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = doc->dict;
  }
  if (dict_00 != dict && dict_00 != (xmlDictPtr)0x0) {
    uVar6 = 0;
    uVar5 = 0;
    if (((node->name != (xmlChar *)0x0) && (uVar5 = uVar6, node->type < XML_COMMENT_NODE)) &&
       ((0xa6U >> (node->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
      iVar2 = xmlDictOwns(dict_00,node->name);
      if (iVar2 != 0) {
        if (dict == (xmlDictPtr)0x0) {
          pxVar3 = xmlStrdup(node->name);
        }
        else {
          pxVar3 = xmlDictLookup(dict,node->name,-1);
        }
        node->name = pxVar3;
        uVar5 = -(uint)(pxVar3 == (xmlChar *)0x0);
      }
    }
    if ((node->content != (xmlChar *)0x0) && (node->type - XML_TEXT_NODE < 2)) {
      iVar2 = xmlDictOwns(dict_00,node->content);
      if (iVar2 != 0) {
        pxVar3 = xmlStrdup(node->content);
        node->content = pxVar3;
        uVar5 = -(uint)(pxVar3 == (xmlChar *)0x0) | uVar5;
      }
    }
  }
  xVar1 = node->type;
  if ((int)xVar1 < 0xe) {
    if (xVar1 == XML_ATTRIBUTE_NODE) {
      if (*(int *)&node->content == 2) {
        xmlRemoveID(doc_00,(xmlAttrPtr)node);
      }
    }
    else if (xVar1 == XML_ENTITY_REF_NODE) {
      node->content = (xmlChar *)0x0;
      node->children = (_xmlNode *)0x0;
      node->last = (_xmlNode *)0x0;
      if ((doc != (xmlDocPtr)0x0) &&
         ((doc->intSubset != (_xmlDtd *)0x0 || (doc->extSubset != (_xmlDtd *)0x0)))) {
        pxVar4 = xmlGetDocEntity(doc,node->name);
        if (pxVar4 != (xmlEntityPtr)0x0) {
          node->children = (_xmlNode *)pxVar4;
          node->last = (_xmlNode *)pxVar4;
          node->content = pxVar4->content;
        }
      }
    }
  }
  else if (xVar1 == XML_DTD_NODE) {
    if (doc_00 != (xmlDocPtr)0x0) {
      if (doc_00->intSubset == (_xmlDtd *)node) {
        doc_00->intSubset = (_xmlDtd *)0x0;
      }
      if (doc_00->extSubset == (_xmlDtd *)node) {
        doc_00->extSubset = (_xmlDtd *)0x0;
      }
    }
  }
  else if (xVar1 == XML_ENTITY_DECL) {
    xmlRemoveEntity((xmlEntityPtr)node);
  }
  node->doc = doc;
  return uVar5;
}

Assistant:

static int
xmlNodeSetDoc(xmlNodePtr node, xmlDocPtr doc) {
    xmlDocPtr oldDoc;
    xmlDictPtr oldDict, newDict;
    int ret = 0;

    /*
     * Remove name and content from old dictionary
     */

    oldDoc = node->doc;
    oldDict = oldDoc ? oldDoc->dict : NULL;
    newDict = doc ? doc->dict : NULL;

    if ((oldDict != NULL) && (oldDict != newDict)) {
        if ((node->name != NULL) &&
            ((node->type == XML_ELEMENT_NODE) ||
             (node->type == XML_ATTRIBUTE_NODE) ||
             (node->type == XML_PI_NODE) ||
             (node->type == XML_ENTITY_REF_NODE)) &&
            (xmlDictOwns(oldDict, node->name))) {
            if (newDict)
                node->name = xmlDictLookup(newDict, node->name, -1);
            else
                node->name = xmlStrdup(node->name);
            if (node->name == NULL)
                ret = -1;
        }

        if ((node->content != NULL) &&
            ((node->type == XML_TEXT_NODE) ||
             (node->type == XML_CDATA_SECTION_NODE)) &&
            (xmlDictOwns(oldDict, node->content))) {
            node->content = xmlStrdup(node->content);
            if (node->content == NULL)
                ret = -1;
        }
    }

    switch (node->type) {
        case XML_ATTRIBUTE_NODE: {
            xmlAttrPtr attr = (xmlAttrPtr) node;

            /*
             * Handle IDs
             *
             * TODO: ID attributes should also be added to the new
             * document, but it's not clear how to handle clashes.
             */
            if (attr->atype == XML_ATTRIBUTE_ID)
                xmlRemoveID(oldDoc, attr);

            break;
        }

        case XML_ENTITY_REF_NODE:
            /*
             * Handle entity references
             */
            node->children = NULL;
            node->last = NULL;
            node->content = NULL;

            if ((doc != NULL) &&
                ((doc->intSubset != NULL) || (doc->extSubset != NULL))) {
                xmlEntityPtr ent;

                /*
                * Assign new entity node if available
                */
                ent = xmlGetDocEntity(doc, node->name);
                if (ent != NULL) {
                    node->children = (xmlNodePtr) ent;
                    node->last = (xmlNodePtr) ent;
                    node->content = ent->content;
                }
            }

            break;

        case XML_DTD_NODE:
            if (oldDoc != NULL) {
                if (oldDoc->intSubset == (xmlDtdPtr) node)
                    oldDoc->intSubset = NULL;
                if (oldDoc->extSubset == (xmlDtdPtr) node)
                    oldDoc->extSubset = NULL;
            }

            break;

        case XML_ENTITY_DECL:
            xmlRemoveEntity((xmlEntityPtr) node);
            break;

        /*
         * TODO:
         * - Remove element decls from doc->elements
         * - Remove attribtue decls form doc->attributes
         */

        default:
            break;
    }

    /*
     * Set new document
     */
    node->doc = doc;

    return(ret);
}